

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000210190 = 0x2d2d2d2d2d2d2d;
    uRam0000000000210197._0_1_ = '-';
    uRam0000000000210197._1_1_ = '-';
    uRam0000000000210197._2_1_ = '-';
    uRam0000000000210197._3_1_ = '-';
    uRam0000000000210197._4_1_ = '-';
    uRam0000000000210197._5_1_ = '-';
    uRam0000000000210197._6_1_ = '-';
    uRam0000000000210197._7_1_ = '-';
    DAT_00210180 = '-';
    DAT_00210180_1._0_1_ = '-';
    DAT_00210180_1._1_1_ = '-';
    DAT_00210180_1._2_1_ = '-';
    DAT_00210180_1._3_1_ = '-';
    DAT_00210180_1._4_1_ = '-';
    DAT_00210180_1._5_1_ = '-';
    DAT_00210180_1._6_1_ = '-';
    uRam0000000000210188 = 0x2d2d2d2d2d2d2d;
    DAT_0021018f = 0x2d;
    DAT_00210170 = '-';
    DAT_00210170_1._0_1_ = '-';
    DAT_00210170_1._1_1_ = '-';
    DAT_00210170_1._2_1_ = '-';
    DAT_00210170_1._3_1_ = '-';
    DAT_00210170_1._4_1_ = '-';
    DAT_00210170_1._5_1_ = '-';
    DAT_00210170_1._6_1_ = '-';
    uRam0000000000210178._0_1_ = '-';
    uRam0000000000210178._1_1_ = '-';
    uRam0000000000210178._2_1_ = '-';
    uRam0000000000210178._3_1_ = '-';
    uRam0000000000210178._4_1_ = '-';
    uRam0000000000210178._5_1_ = '-';
    uRam0000000000210178._6_1_ = '-';
    uRam0000000000210178._7_1_ = '-';
    DAT_00210160 = '-';
    DAT_00210160_1._0_1_ = '-';
    DAT_00210160_1._1_1_ = '-';
    DAT_00210160_1._2_1_ = '-';
    DAT_00210160_1._3_1_ = '-';
    DAT_00210160_1._4_1_ = '-';
    DAT_00210160_1._5_1_ = '-';
    DAT_00210160_1._6_1_ = '-';
    uRam0000000000210168._0_1_ = '-';
    uRam0000000000210168._1_1_ = '-';
    uRam0000000000210168._2_1_ = '-';
    uRam0000000000210168._3_1_ = '-';
    uRam0000000000210168._4_1_ = '-';
    uRam0000000000210168._5_1_ = '-';
    uRam0000000000210168._6_1_ = '-';
    uRam0000000000210168._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000210158._0_1_ = '-';
    uRam0000000000210158._1_1_ = '-';
    uRam0000000000210158._2_1_ = '-';
    uRam0000000000210158._3_1_ = '-';
    uRam0000000000210158._4_1_ = '-';
    uRam0000000000210158._5_1_ = '-';
    uRam0000000000210158._6_1_ = '-';
    uRam0000000000210158._7_1_ = '-';
    DAT_0021019f = 0;
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar2,'\n');
  colourGuard.m_moved = false;
  Colour::use(FileName);
  poVar2 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(poVar2,&lineInfo);
  std::operator<<(poVar2,'\n');
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000210230 = 0x2e2e2e2e2e2e2e;
    uRam0000000000210237._0_1_ = '.';
    uRam0000000000210237._1_1_ = '.';
    uRam0000000000210237._2_1_ = '.';
    uRam0000000000210237._3_1_ = '.';
    uRam0000000000210237._4_1_ = '.';
    uRam0000000000210237._5_1_ = '.';
    uRam0000000000210237._6_1_ = '.';
    uRam0000000000210237._7_1_ = '.';
    DAT_00210220 = '.';
    DAT_00210220_1._0_1_ = '.';
    DAT_00210220_1._1_1_ = '.';
    DAT_00210220_1._2_1_ = '.';
    DAT_00210220_1._3_1_ = '.';
    DAT_00210220_1._4_1_ = '.';
    DAT_00210220_1._5_1_ = '.';
    DAT_00210220_1._6_1_ = '.';
    uRam0000000000210228 = 0x2e2e2e2e2e2e2e;
    DAT_0021022f = 0x2e;
    DAT_00210210 = '.';
    DAT_00210210_1._0_1_ = '.';
    DAT_00210210_1._1_1_ = '.';
    DAT_00210210_1._2_1_ = '.';
    DAT_00210210_1._3_1_ = '.';
    DAT_00210210_1._4_1_ = '.';
    DAT_00210210_1._5_1_ = '.';
    DAT_00210210_1._6_1_ = '.';
    uRam0000000000210218._0_1_ = '.';
    uRam0000000000210218._1_1_ = '.';
    uRam0000000000210218._2_1_ = '.';
    uRam0000000000210218._3_1_ = '.';
    uRam0000000000210218._4_1_ = '.';
    uRam0000000000210218._5_1_ = '.';
    uRam0000000000210218._6_1_ = '.';
    uRam0000000000210218._7_1_ = '.';
    DAT_00210200 = '.';
    DAT_00210200_1._0_1_ = '.';
    DAT_00210200_1._1_1_ = '.';
    DAT_00210200_1._2_1_ = '.';
    DAT_00210200_1._3_1_ = '.';
    DAT_00210200_1._4_1_ = '.';
    DAT_00210200_1._5_1_ = '.';
    DAT_00210200_1._6_1_ = '.';
    uRam0000000000210208._0_1_ = '.';
    uRam0000000000210208._1_1_ = '.';
    uRam0000000000210208._2_1_ = '.';
    uRam0000000000210208._3_1_ = '.';
    uRam0000000000210208._4_1_ = '.';
    uRam0000000000210208._5_1_ = '.';
    uRam0000000000210208._6_1_ = '.';
    uRam0000000000210208._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000002101f8._0_1_ = '.';
    uRam00000000002101f8._1_1_ = '.';
    uRam00000000002101f8._2_1_ = '.';
    uRam00000000002101f8._3_1_ = '.';
    uRam00000000002101f8._4_1_ = '.';
    uRam00000000002101f8._5_1_ = '.';
    uRam00000000002101f8._6_1_ = '.';
    uRam00000000002101f8._7_1_ = '.';
    DAT_0021023f = 0;
  }
  poVar2 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::endl<char,std::char_traits<char>>(poVar2);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}